

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O1

void __thiscall
charls::process_transformed<charls::transform_hp3<unsigned_char>_>::decode_transform
          (process_transformed<charls::transform_hp3<unsigned_char>_> *this,void *source,
          void *destination,size_t pixel_count,size_t byte_stride)

{
  undefined1 uVar1;
  int iVar2;
  interleave_mode iVar3;
  undefined1 *puVar4;
  
  iVar2 = this->frame_info_->component_count;
  if (iVar2 == 4) {
    iVar3 = this->parameters_->interleave_mode;
    if (iVar3 == Line) {
      transform_line_to_quad<charls::transform_hp3<unsigned_char>::inverse,unsigned_char>
                ((uchar *)source,byte_stride,(quad<unsigned_char> *)destination,pixel_count,
                 (inverse *)&this->field_0x51);
    }
    else if (iVar3 == Sample) {
      transform_line<charls::transform_hp3<unsigned_char>::inverse,unsigned_char>
                ((quad<unsigned_char> *)destination,(quad<unsigned_char> *)source,pixel_count,
                 (inverse *)&this->field_0x51);
    }
  }
  else if (iVar2 == 3) {
    if (this->parameters_->interleave_mode == Sample) {
      transform_line<charls::transform_hp3<unsigned_char>::inverse,unsigned_char>
                ((triplet<unsigned_char> *)destination,(triplet<unsigned_char> *)source,pixel_count,
                 (inverse *)&this->field_0x51);
    }
    else {
      transform_line_to_triplet<charls::transform_hp3<unsigned_char>::inverse,unsigned_char>
                ((uchar *)source,byte_stride,(triplet<unsigned_char> *)destination,pixel_count,
                 (inverse *)&this->field_0x51);
    }
  }
  if ((this->parameters_->output_bgr == true) && (pixel_count != 0)) {
    iVar2 = this->frame_info_->component_count;
    puVar4 = (undefined1 *)((long)destination + 2);
    do {
      uVar1 = puVar4[-2];
      puVar4[-2] = *puVar4;
      *puVar4 = uVar1;
      puVar4 = puVar4 + iVar2;
      pixel_count = pixel_count - 1;
    } while (pixel_count != 0);
  }
  return;
}

Assistant:

void decode_transform(const void* source, void* destination, const size_t pixel_count, const size_t byte_stride) noexcept
    {
        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, inverse_transform_);
            }
            else
            {
                transform_line_to_triplet(static_cast<const size_type*>(source), byte_stride,
                                          static_cast<triplet<size_type>*>(destination), pixel_count, inverse_transform_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, inverse_transform_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_line_to_quad(static_cast<const size_type*>(source), byte_stride,
                                       static_cast<quad<size_type>*>(destination), pixel_count, inverse_transform_);
            }
        }

        if (parameters_.output_bgr)
        {
            transform_rgb_to_bgr(static_cast<size_type*>(destination), frame_info_.component_count, pixel_count);
        }
    }